

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

RK_U32 mpp_buffer_to_addr(MppBuffer buffer,size_t offset)

{
  RK_U32 addr;
  MppBufferImpl *impl;
  size_t offset_local;
  MppBuffer buffer_local;
  
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","NULL buffer convert to zero address\n","mpp_buffer_to_addr");
    buffer_local._4_4_ = 0;
  }
  else if (*(int *)((long)buffer + 0xa0) < 0x400) {
    if (*(long *)((long)buffer + 0xa8) + offset < 0x400000) {
      buffer_local._4_4_ =
           *(int *)((long)buffer + 0xa0) +
           ((int)*(undefined8 *)((long)buffer + 0xa8) + (int)offset) * 0x400;
    }
    else {
      _mpp_log_l(2,"mpp_buffer","offset %d + %d is larger than 4M use extra info to send offset\n",
                 "mpp_buffer_to_addr");
      buffer_local._4_4_ = 0;
    }
  }
  else {
    _mpp_log_l(2,"mpp_buffer","buffer fd %d is too large\n","mpp_buffer_to_addr");
    buffer_local._4_4_ = 0;
  }
  return buffer_local._4_4_;
}

Assistant:

RK_U32 mpp_buffer_to_addr(MppBuffer buffer, size_t offset)
{
    MppBufferImpl *impl = (MppBufferImpl *)buffer;

    if (NULL == impl) {
        mpp_err_f("NULL buffer convert to zero address\n");
        return 0;
    }

    if (impl->info.fd >= (1 << 10)) {
        mpp_err_f("buffer fd %d is too large\n");
        return 0;
    }

    if (impl->offset + offset >= SZ_4M) {
        mpp_err_f("offset %d + %d is larger than 4M use extra info to send offset\n");
        return 0;
    }

    RK_U32 addr = impl->info.fd + ((impl->offset + offset) << 10);

    return addr;
}